

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void paste_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  
  pasteoffset = ipasteoffset;
  if (1 < gridx) {
    pasteoffset = ((ipasteoffset + -1) / gridx + 1) * gridx;
  }
  if (1 < gridy) {
    pasteoffset = ((pasteoffset + -1) / gridy + 1) * gridy;
  }
  undo_checkpoint();
  undo_suspend();
  pcVar2 = cutfname(0);
  iVar1 = read_file(pcVar2,1);
  if (iVar1 == 0) {
    pcVar2 = cutfname(0);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fl_message("Can\'t read %s: %s",pcVar2,pcVar4);
  }
  undo_resume();
  ipasteoffset = ipasteoffset + 10;
  pasteoffset = 0;
  force_parent = 0;
  return;
}

Assistant:

void paste_cb(Fl_Widget*, void*) {
  //if (ipasteoffset) force_parent = 1;
  pasteoffset = ipasteoffset;
  if (gridx>1) pasteoffset = ((pasteoffset-1)/gridx+1)*gridx;
  if (gridy>1) pasteoffset = ((pasteoffset-1)/gridy+1)*gridy;
  undo_checkpoint();
  undo_suspend();
  if (!read_file(cutfname(), 1)) {
    fl_message("Can't read %s: %s", cutfname(), strerror(errno));
  }
  undo_resume();
  pasteoffset = 0;
  ipasteoffset += 10;
  force_parent = 0;
}